

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.cc
# Opt level: O3

void __thiscall OpenMesh::ArrayKernel::clean(ArrayKernel *this)

{
  pointer pVVar1;
  pointer pEVar2;
  pointer pFVar3;
  
  pVVar1 = (this->vertices_).
           super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->vertices_).
  super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertices_).
  super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertices_).
  super__Vector_base<OpenMesh::ArrayItems::Vertex,_std::allocator<OpenMesh::ArrayItems::Vertex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1);
  }
  pEVar2 = (this->edges_).
           super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->edges_).
  super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges_).
  super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges_).
  super__Vector_base<OpenMesh::ArrayItems::Edge,_std::allocator<OpenMesh::ArrayItems::Edge>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pEVar2 != (pointer)0x0) {
    operator_delete(pEVar2);
  }
  pFVar3 = (this->faces_).
           super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->faces_).
  super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faces_).
  super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faces_).
  super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pFVar3 != (pointer)0x0) {
    operator_delete(pFVar3);
    return;
  }
  return;
}

Assistant:

void ArrayKernel::clean()
{

  vertices_.clear();
  VertexContainer().swap( vertices_ );

  edges_.clear();
  EdgeContainer().swap( edges_ );

  faces_.clear();
  FaceContainer().swap( faces_ );

}